

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O2

DIEsForAddress * __thiscall
llvm::DWARFContext::getDIEsForAddress
          (DIEsForAddress *__return_storage_ptr__,DWARFContext *this,uint64_t Address)

{
  DWARFDebugInfoEntry *pDVar1;
  bool bVar2;
  Tag TVar3;
  DWARFUnit *this_00;
  DWARFDebugInfoEntry **this_01;
  DWARFDie DVar4;
  undefined1 auStack_98 [8];
  DWARFDie Child;
  undefined1 auStack_78 [8];
  vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_> Worklist;
  undefined1 auStack_58 [8];
  iterator __begin2;
  DWARFDie DIE;
  
  (__return_storage_ptr__->FunctionDIE).Die = (DWARFDebugInfoEntry *)0x0;
  (__return_storage_ptr__->BlockDIE).U = (DWARFUnit *)0x0;
  __return_storage_ptr__->CompileUnit = (DWARFCompileUnit *)0x0;
  (__return_storage_ptr__->FunctionDIE).U = (DWARFUnit *)0x0;
  (__return_storage_ptr__->BlockDIE).Die = (DWARFDebugInfoEntry *)0x0;
  this_00 = &getCompileUnitForAddress(this,Address)->super_DWARFUnit;
  if (this_00 != (DWARFUnit *)0x0) {
    __return_storage_ptr__->CompileUnit = (DWARFCompileUnit *)this_00;
    DVar4 = DWARFUnit::getSubroutineForAddress(this_00,Address);
    __return_storage_ptr__->FunctionDIE = DVar4;
    auStack_78 = (undefined1  [8])0x0;
    Worklist.super__Vector_base<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    Worklist.super__Vector_base<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>::push_back
              ((vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_> *)auStack_78,
               &__return_storage_ptr__->FunctionDIE);
    Child.Die = (DWARFDebugInfoEntry *)__return_storage_ptr__;
    while (this_01 = &__begin2.Die.Die,
          auStack_78 !=
          (undefined1  [8])
          Worklist.super__Vector_base<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>._M_impl.
          super__Vector_impl_data._M_start) {
      __begin2.Die.Die =
           (DWARFDebugInfoEntry *)
           Worklist.super__Vector_base<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>._M_impl.
           super__Vector_impl_data._M_start[-1].U;
      pDVar1 = Worklist.super__Vector_base<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>._M_impl.
               super__Vector_impl_data._M_start[-1].Die;
      Worklist.super__Vector_base<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>._M_impl.
      super__Vector_impl_data._M_start =
           Worklist.super__Vector_base<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>._M_impl.
           super__Vector_impl_data._M_start + -1;
      if (((DWARFUnit *)__begin2.Die.Die != (DWARFUnit *)0x0) &&
         (pDVar1 != (DWARFDebugInfoEntry *)0x0)) {
        TVar3 = DWARFDie::getTag((DWARFDie *)this_01);
        if ((TVar3 == DW_TAG_lexical_block) &&
           (bVar2 = DWARFDie::addressRangeContainsAddress((DWARFDie *)this_01,Address), bVar2)) {
          (__return_storage_ptr__->BlockDIE).U = (DWARFUnit *)__begin2.Die.Die;
          (__return_storage_ptr__->BlockDIE).Die = pDVar1;
          break;
        }
        _auStack_58 = DWARFDie::getFirstChild((DWARFDie *)this_01);
        DVar4 = DWARFDie::getLastChild((DWARFDie *)this_01);
        while( true ) {
          __return_storage_ptr__ = (DIEsForAddress *)Child.Die;
          if (DVar4 == _auStack_58) break;
          auStack_98 = auStack_58;
          Child.U = __begin2.Die.U;
          std::vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>::push_back
                    ((vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_> *)auStack_78,
                     (value_type *)auStack_98);
          DWARFDie::iterator::operator++((iterator *)auStack_58);
        }
      }
    }
    std::_Vector_base<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>::~_Vector_base
              ((_Vector_base<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_> *)auStack_78);
  }
  return __return_storage_ptr__;
}

Assistant:

DWARFContext::DIEsForAddress DWARFContext::getDIEsForAddress(uint64_t Address) {
  DIEsForAddress Result;

  DWARFCompileUnit *CU = getCompileUnitForAddress(Address);
  if (!CU)
    return Result;

  Result.CompileUnit = CU;
  Result.FunctionDIE = CU->getSubroutineForAddress(Address);

  std::vector<DWARFDie> Worklist;
  Worklist.push_back(Result.FunctionDIE);
  while (!Worklist.empty()) {
    DWARFDie DIE = Worklist.back();
    Worklist.pop_back();

    if (!DIE.isValid())
      continue;

    if (DIE.getTag() == DW_TAG_lexical_block &&
        DIE.addressRangeContainsAddress(Address)) {
      Result.BlockDIE = DIE;
      break;
    }

    for (auto Child : DIE)
      Worklist.push_back(Child);
  }

  return Result;
}